

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::permuteTest<false>(ViewTest *this)

{
  int iVar1;
  undefined8 uVar2;
  value_type *__val;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  reference piVar5;
  size_t sVar6;
  size_t sVar7;
  logic_error *plVar8;
  code *pcVar9;
  size_t sVar10;
  value_type *__val_2;
  undefined *puVar11;
  value_type *__val_3;
  int *piVar12;
  size_t sVar13;
  size_t sVar14;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  View<int,_false,_std::allocator<unsigned_long>_> w2;
  View<int,_false,_std::allocator<unsigned_long>_> w1;
  View<int,_false,_std::allocator<unsigned_long>_> w3;
  View<int,_false,_std::allocator<unsigned_long>_> w4;
  View<int,_false,_std::allocator<unsigned_long>_> w5;
  undefined1 local_1c8 [16];
  size_t *local_1b8;
  size_t local_1a0;
  int *local_188;
  allocator_type local_179;
  undefined1 local_178 [16];
  size_t *local_168;
  size_t local_150;
  CoordinateOrder local_134;
  undefined1 local_130 [16];
  size_t *local_120;
  size_t local_108;
  undefined1 local_f0 [16];
  size_t *local_e0;
  size_t local_c8;
  undefined1 local_b0 [16];
  size_t *local_a0;
  size_t local_88;
  undefined1 local_70 [16];
  size_t *local_60;
  size_t local_48;
  
  _Var3._M_current = (unsigned_long *)operator_new(0x10);
  _Var4._M_current = _Var3._M_current + 2;
  *_Var3._M_current = 0;
  _Var3._M_current[1] = 0;
  *_Var3._M_current = 6;
  _Var3._M_current[1] = 4;
  piVar12 = this->data_;
  local_1c8._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,_Var4,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_130);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
  local_130._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_130 + 8),_Var3,_Var4,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_178);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130);
  local_178._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_178 + 8),_Var3,_Var4,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_f0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_178);
  _Var4._M_current = (unsigned_long *)operator_new(0x10);
  *_Var4._M_current = 0;
  _Var4._M_current[1] = 0;
  *_Var4._M_current = 1;
  _Var4._M_current[1] = 0;
  local_188 = piVar12;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_130,_Var4);
  *_Var4._M_current = 0;
  _Var4._M_current[1] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_178,_Var4);
  sVar14 = 0;
  do {
    sVar10 = 0;
    do {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_1c8,sVar14,sVar10);
      iVar1 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_130,sVar10,sVar14);
      if (iVar1 != *piVar5) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_1c8,sVar14,sVar10);
      iVar1 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_178,sVar14,sVar10);
      if (iVar1 != *piVar5) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != 4);
    sVar14 = sVar14 + 1;
  } while (sVar14 != 6);
  operator_delete(_Var4._M_current,0x10);
  operator_delete(local_168,local_150 * 0x18);
  operator_delete(local_120,local_108 * 0x18);
  operator_delete(local_1b8,local_1a0 * 0x18);
  operator_delete(_Var3._M_current,0x10);
  _Var3._M_current = (unsigned_long *)operator_new(0x10);
  _Var4._M_current = _Var3._M_current + 2;
  *_Var3._M_current = 0;
  _Var3._M_current[1] = 0;
  *_Var3._M_current = 6;
  _Var3._M_current[1] = 4;
  local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
  local_1c8._0_8_ = local_188;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,_Var4,
             (CoordinateOrder *)local_130,&andres::defaultOrder,(allocator_type *)local_178);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
  piVar12 = local_188;
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  local_130._0_8_ = local_188;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_130 + 8),_Var3,_Var4,
             (CoordinateOrder *)local_178,&andres::defaultOrder,(allocator_type *)local_f0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130);
  local_f0._0_8_ = (ulong)(uint)local_f0._4_4_ << 0x20;
  local_178._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_178 + 8),_Var3,_Var4,
             (CoordinateOrder *)local_f0,&andres::defaultOrder,(allocator_type *)local_b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_178);
  _Var4._M_current = (unsigned_long *)operator_new(0x10);
  *_Var4._M_current = 0;
  _Var4._M_current[1] = 0;
  *_Var4._M_current = 1;
  _Var4._M_current[1] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_130,_Var4);
  *_Var4._M_current = 0;
  _Var4._M_current[1] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_178,_Var4);
  sVar14 = 0;
  do {
    sVar10 = 0;
    do {
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_1c8,sVar14,sVar10);
      iVar1 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_130,sVar10,sVar14);
      if (iVar1 != *piVar5) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_1c8,sVar14,sVar10);
      iVar1 = *piVar5;
      piVar5 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_178,sVar14,sVar10);
      if (iVar1 != *piVar5) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != 4);
    sVar14 = sVar14 + 1;
  } while (sVar14 != 6);
  operator_delete(_Var4._M_current,0x10);
  operator_delete(local_168,local_150 * 0x18);
  operator_delete(local_120,local_108 * 0x18);
  operator_delete(local_1b8,local_1a0 * 0x18);
  operator_delete(_Var3._M_current,0x10);
  _Var3._M_current = (unsigned_long *)operator_new(0x18);
  piVar12 = local_188;
  _Var4._M_current = _Var3._M_current + 3;
  *_Var3._M_current = 0;
  _Var3._M_current[1] = 0;
  *_Var3._M_current = 3;
  _Var3._M_current[1] = 4;
  _Var3._M_current[2] = 2;
  local_1c8._0_8_ = local_188;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,_Var4,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_130);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
  local_130._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_130 + 8),_Var3,_Var4,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_178);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130);
  local_178._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_178 + 8),_Var3,_Var4,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_f0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_178);
  local_f0._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f0 + 8),_Var3,_Var4,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0);
  local_b0._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b0 + 8),_Var3,_Var4,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)local_70);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
  local_70._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var3,_Var4,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&local_134);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
  _Var4._M_current = (unsigned_long *)operator_new(0x18);
  *_Var4._M_current = 0;
  _Var4._M_current[1] = 0;
  _Var4._M_current[1] = 1;
  _Var4._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_130,_Var4);
  *_Var4._M_current = 1;
  _Var4._M_current[1] = 0;
  _Var4._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_178,_Var4);
  *_Var4._M_current = 0;
  _Var4._M_current[1] = 2;
  _Var4._M_current[2] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_f0,_Var4);
  *_Var4._M_current = 2;
  _Var4._M_current[1] = 1;
  _Var4._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_b0,_Var4);
  *_Var4._M_current = 1;
  _Var4._M_current[1] = 2;
  _Var4._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_70,_Var4);
  sVar14 = 0;
  do {
    sVar10 = 0;
    do {
      sVar13 = 0;
      do {
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
        uVar2 = local_1c8._0_8_;
        if (((int *)local_1c8._0_8_ == (int *)0x0) || (local_1a0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001abafd:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001abb0b:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,3,sVar10,
                           sVar13);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130);
        uVar2 = local_130._0_8_;
        if (((int *)local_130._0_8_ == (int *)0x0) || (local_108 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001abafd;
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130,3,sVar10,
                           sVar13);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001abb0b;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
        uVar2 = local_1c8._0_8_;
        if (((int *)local_1c8._0_8_ == (int *)0x0) || (local_1a0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001aba84:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001abc67:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,3,sVar10,
                           sVar13);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_178);
        uVar2 = local_178._0_8_;
        if (((int *)local_178._0_8_ == (int *)0x0) || (local_150 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001aba84;
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_178,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_178,3,sVar14,
                           sVar13);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar10 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001abc67;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
        uVar2 = local_1c8._0_8_;
        if (((int *)local_1c8._0_8_ == (int *)0x0) || (local_1a0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001abca9:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001abcb7:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,3,sVar10,
                           sVar13);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0);
        uVar2 = local_f0._0_8_;
        if (((int *)local_f0._0_8_ == (int *)0x0) || (local_c8 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001abca9;
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0,3,sVar13,
                           sVar10);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001abcb7;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
        uVar2 = local_1c8._0_8_;
        if (((int *)local_1c8._0_8_ == (int *)0x0) || (local_1a0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001abb9a:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001abba8:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,3,sVar10,
                           sVar13);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
        uVar2 = local_b0._0_8_;
        if (((int *)local_b0._0_8_ == (int *)0x0) || (local_88 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001abb9a;
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0,3,sVar10,
                           sVar14);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar13 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001abba8;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
        uVar2 = local_1c8._0_8_;
        if (((int *)local_1c8._0_8_ == (int *)0x0) || (local_1a0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001abc27:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001abc35:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,3,sVar10,
                           sVar13);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
        uVar2 = local_70._0_8_;
        if (((int *)local_70._0_8_ == (int *)0x0) || (local_48 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001abc27;
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70,3,sVar13,
                           sVar14);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar10 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001abc35;
        }
        sVar13 = sVar13 + 1;
      } while (sVar13 == 1);
      sVar10 = sVar10 + 1;
    } while (sVar10 != 4);
    sVar14 = sVar14 + 1;
  } while (sVar14 != 3);
  operator_delete(_Var4._M_current,0x18);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(local_a0,local_88 * 0x18);
  operator_delete(local_e0,local_c8 * 0x18);
  operator_delete(local_168,local_150 * 0x18);
  operator_delete(local_120,local_108 * 0x18);
  operator_delete(local_1b8,local_1a0 * 0x18);
  operator_delete(_Var3._M_current,0x18);
  _Var3._M_current = (unsigned_long *)operator_new(0x18);
  _Var4._M_current = _Var3._M_current + 3;
  *_Var3._M_current = 0;
  _Var3._M_current[1] = 0;
  *_Var3._M_current = 3;
  _Var3._M_current[1] = 4;
  _Var3._M_current[2] = 2;
  local_130._0_8_ = local_130._0_8_ & 0xffffffff00000000;
  local_1c8._0_8_ = local_188;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,_Var4,
             (CoordinateOrder *)local_130,&andres::defaultOrder,(allocator_type *)local_178);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
  piVar12 = local_188;
  local_178._0_8_ = local_178._0_8_ & 0xffffffff00000000;
  local_130._0_8_ = local_188;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_130 + 8),_Var3,_Var4,
             (CoordinateOrder *)local_178,&andres::defaultOrder,(allocator_type *)local_f0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130);
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffff00000000;
  local_178._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_178 + 8),_Var3,_Var4,
             (CoordinateOrder *)local_f0,&andres::defaultOrder,(allocator_type *)local_b0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_178);
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_f0._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_f0 + 8),_Var3,_Var4,
             (CoordinateOrder *)local_b0,&andres::defaultOrder,(allocator_type *)local_70);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0);
  local_70._0_8_ = local_70._0_8_ & 0xffffffff00000000;
  local_b0._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_b0 + 8),_Var3,_Var4,
             (CoordinateOrder *)local_70,&andres::defaultOrder,(allocator_type *)&local_134);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
  local_134 = FirstMajorOrder;
  local_70._0_8_ = piVar12;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var3,_Var4,&local_134,
             &andres::defaultOrder,&local_179);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
  _Var4._M_current = (unsigned_long *)operator_new(0x18);
  *_Var4._M_current = 0;
  _Var4._M_current[1] = 0;
  _Var4._M_current[1] = 1;
  _Var4._M_current[2] = 2;
  local_188 = (int *)_Var4._M_current;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_130,_Var4);
  *_Var4._M_current = 1;
  _Var4._M_current[1] = 0;
  _Var4._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_178,_Var4);
  *_Var4._M_current = 0;
  _Var4._M_current[1] = 2;
  _Var4._M_current[2] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_f0,_Var4);
  *_Var4._M_current = 2;
  _Var4._M_current[1] = 1;
  _Var4._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_b0,_Var4);
  *_Var4._M_current = 1;
  _Var4._M_current[1] = 2;
  _Var4._M_current[2] = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  permute<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_70,_Var4);
  sVar14 = 0;
  do {
    sVar10 = 0;
    do {
      sVar13 = 0;
      do {
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
        uVar2 = local_1c8._0_8_;
        if (((int *)local_1c8._0_8_ == (int *)0x0) || (local_1a0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001abd72:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001abd80:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,3,sVar10,
                           sVar13);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130);
        uVar2 = local_130._0_8_;
        if (((int *)local_130._0_8_ == (int *)0x0) || (local_108 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001abd72;
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_130,3,sVar10,
                           sVar13);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001abd80;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
        uVar2 = local_1c8._0_8_;
        if (((int *)local_1c8._0_8_ == (int *)0x0) || (local_1a0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001abcf9:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001abedc:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,3,sVar10,
                           sVar13);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_178);
        uVar2 = local_178._0_8_;
        if (((int *)local_178._0_8_ == (int *)0x0) || (local_150 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001abcf9;
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_178,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_178,3,sVar14,
                           sVar13);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar10 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001abedc;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
        uVar2 = local_1c8._0_8_;
        if (((int *)local_1c8._0_8_ == (int *)0x0) || (local_1a0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001abf1e:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001abf2c:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,3,sVar10,
                           sVar13);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0);
        uVar2 = local_f0._0_8_;
        if (((int *)local_f0._0_8_ == (int *)0x0) || (local_c8 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001abf1e;
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_f0,3,sVar13,
                           sVar10);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001abf2c;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
        uVar2 = local_1c8._0_8_;
        if (((int *)local_1c8._0_8_ == (int *)0x0) || (local_1a0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001abe0f:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001abe1d:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,3,sVar10,
                           sVar13);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
        uVar2 = local_b0._0_8_;
        if (((int *)local_b0._0_8_ == (int *)0x0) || (local_88 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001abe0f;
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0,3,sVar10,
                           sVar14);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar13 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001abe1d;
        }
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
        uVar2 = local_1c8._0_8_;
        if (((int *)local_1c8._0_8_ == (int *)0x0) || (local_1a0 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
LAB_001abe9c:
          pcVar9 = std::runtime_error::~runtime_error;
          puVar11 = &std::runtime_error::typeinfo;
LAB_001abeaa:
          __cxa_throw(plVar8,puVar11,pcVar9);
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,3,sVar10,
                           sVar13);
        iVar1 = *(int *)(uVar2 + (sVar6 * sVar14 + sVar7) * 4);
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
        uVar2 = local_70._0_8_;
        if (((int *)local_70._0_8_ == (int *)0x0) || (local_48 != 3)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          goto LAB_001abe9c;
        }
        sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70,0);
        sVar7 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70,3,sVar13,
                           sVar14);
        if (iVar1 != *(int *)(uVar2 + (sVar6 * sVar10 + sVar7) * 4)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar11 = &std::logic_error::typeinfo;
          goto LAB_001abeaa;
        }
        sVar13 = sVar13 + 1;
      } while (sVar13 == 1);
      sVar10 = sVar10 + 1;
    } while (sVar10 != 4);
    sVar14 = sVar14 + 1;
    if (sVar14 == 3) {
      operator_delete(local_188,0x18);
      operator_delete(local_60,local_48 * 0x18);
      operator_delete(local_a0,local_88 * 0x18);
      operator_delete(local_e0,local_c8 * 0x18);
      operator_delete(local_168,local_150 * 0x18);
      operator_delete(local_120,local_108 * 0x18);
      operator_delete(local_1b8,local_1a0 * 0x18);
      operator_delete(_Var3._M_current,0x18);
      return;
    }
  } while( true );
}

Assistant:

void ViewTest::permuteTest() {
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_);
        std::vector<std::size_t> permutation(2);
        permutation[0] = 1;
        permutation[1] = 0;
        w1.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 1;
        w2.permute(permutation.begin());

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
            }
        }
    }
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        std::vector<std::size_t> permutation(2);
        permutation[0] = 1;
        permutation[1] = 0;
        w1.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 1;
        w2.permute(permutation.begin());

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
            }
        }
    }
    // 3D 
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_);
        std::vector<std::size_t> permutation(3);
        permutation[0] = 0;
        permutation[1] = 1; 
        permutation[2] = 2;
        w1.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 0; 
        permutation[2] = 2;
        w2.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 2; 
        permutation[2] = 1;
        w3.permute(permutation.begin());
        permutation[0] = 2;
        permutation[1] = 1; 
        permutation[2] = 0;
        w4.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 2; 
        permutation[2] = 0;
        w5.permute(permutation.begin());

        for(std::size_t x=0; x<3; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                for(std::size_t z=0; z<2; ++z) {
                    test(v(x, y, z) == w1(x, y, z));
                    test(v(x, y, z) == w2(y, x, z));
                    test(v(x, y, z) == w3(x, z, y));
                    test(v(x, y, z) == w4(z, y, x));
                    test(v(x, y, z) == w5(y, z, x));
                }
            }
        }
    }
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
        std::vector<std::size_t> permutation(3);
        permutation[0] = 0;
        permutation[1] = 1; 
        permutation[2] = 2;
        w1.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 0; 
        permutation[2] = 2;
        w2.permute(permutation.begin());
        permutation[0] = 0;
        permutation[1] = 2; 
        permutation[2] = 1;
        w3.permute(permutation.begin());
        permutation[0] = 2;
        permutation[1] = 1; 
        permutation[2] = 0;
        w4.permute(permutation.begin());
        permutation[0] = 1;
        permutation[1] = 2; 
        permutation[2] = 0;
        w5.permute(permutation.begin());

        for(std::size_t x=0; x<3; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                for(std::size_t z=0; z<2; ++z) {
                    test(v(x, y, z) == w1(x, y, z));
                    test(v(x, y, z) == w2(y, x, z));
                    test(v(x, y, z) == w3(x, z, y));
                    test(v(x, y, z) == w4(z, y, x));
                    test(v(x, y, z) == w5(y, z, x));
                }
            }
        }
    }
}